

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vktApiObjectManagementTests.cpp
# Opt level: O3

Parameters *
vkt::api::anon_unknown_1::PipelineLayout::Parameters::singleDescriptorSet
          (Parameters *__return_storage_ptr__,Parameters *descriptorSetLayout)

{
  pointer this;
  Parameters *pPVar1;
  
  (__return_storage_ptr__->pushConstantRanges).
  super__Vector_base<vk::VkPushConstantRange,_std::allocator<vk::VkPushConstantRange>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  (__return_storage_ptr__->pushConstantRanges).
  super__Vector_base<vk::VkPushConstantRange,_std::allocator<vk::VkPushConstantRange>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (__return_storage_ptr__->descriptorSetLayouts).
  super__Vector_base<vkt::api::(anonymous_namespace)::DescriptorSetLayout::Parameters,_std::allocator<vkt::api::(anonymous_namespace)::DescriptorSetLayout::Parameters>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (__return_storage_ptr__->pushConstantRanges).
  super__Vector_base<vk::VkPushConstantRange,_std::allocator<vk::VkPushConstantRange>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  (__return_storage_ptr__->descriptorSetLayouts).
  super__Vector_base<vkt::api::(anonymous_namespace)::DescriptorSetLayout::Parameters,_std::allocator<vkt::api::(anonymous_namespace)::DescriptorSetLayout::Parameters>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (__return_storage_ptr__->descriptorSetLayouts).
  super__Vector_base<vkt::api::(anonymous_namespace)::DescriptorSetLayout::Parameters,_std::allocator<vkt::api::(anonymous_namespace)::DescriptorSetLayout::Parameters>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  this = std::
         _Vector_base<vkt::api::(anonymous_namespace)::DescriptorSetLayout::Parameters,_std::allocator<vkt::api::(anonymous_namespace)::DescriptorSetLayout::Parameters>_>
         ::_M_allocate((_Vector_base<vkt::api::(anonymous_namespace)::DescriptorSetLayout::Parameters,_std::allocator<vkt::api::(anonymous_namespace)::DescriptorSetLayout::Parameters>_>
                        *)&DAT_00000001,(size_t)descriptorSetLayout);
  std::
  vector<vkt::api::(anonymous_namespace)::DescriptorSetLayout::Parameters::Binding,_std::allocator<vkt::api::(anonymous_namespace)::DescriptorSetLayout::Parameters::Binding>_>
  ::vector(&this->bindings,&descriptorSetLayout->bindings);
  pPVar1 = (Parameters *)(this + 1);
  (__return_storage_ptr__->descriptorSetLayouts).
  super__Vector_base<vkt::api::(anonymous_namespace)::DescriptorSetLayout::Parameters,_std::allocator<vkt::api::(anonymous_namespace)::DescriptorSetLayout::Parameters>_>
  ._M_impl.super__Vector_impl_data._M_start = this;
  (__return_storage_ptr__->descriptorSetLayouts).
  super__Vector_base<vkt::api::(anonymous_namespace)::DescriptorSetLayout::Parameters,_std::allocator<vkt::api::(anonymous_namespace)::DescriptorSetLayout::Parameters>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)pPVar1;
  (__return_storage_ptr__->descriptorSetLayouts).
  super__Vector_base<vkt::api::(anonymous_namespace)::DescriptorSetLayout::Parameters,_std::allocator<vkt::api::(anonymous_namespace)::DescriptorSetLayout::Parameters>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)pPVar1;
  return pPVar1;
}

Assistant:

static Parameters singleDescriptorSet (const DescriptorSetLayout::Parameters& descriptorSetLayout)
		{
			Parameters params;
			params.descriptorSetLayouts.push_back(descriptorSetLayout);
			return params;
		}